

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v6::detail::bigint::remove_leading_zeros(bigint *this)

{
  uint uVar1;
  ulong uVar2;
  char *in_RAX;
  ulong uVar3;
  char *unaff_RBX;
  
  uVar1 = (uint)(this->bigits_).super_buffer<unsigned_int>.size_;
  uVar2 = (ulong)uVar1;
  do {
    uVar3 = uVar2;
    if ((int)uVar3 < 2) {
      if ((int)uVar1 < 0) {
        assert_fail(unaff_RBX,0,in_RAX);
      }
      break;
    }
    uVar2 = uVar3 - 1;
  } while ((this->bigits_).super_buffer<unsigned_int>.ptr_[uVar3 - 1] == 0);
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar3) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this,uVar3);
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar3;
  return;
}

Assistant:

void remove_leading_zeros() {
    int num_bigits = static_cast<int>(bigits_.size()) - 1;
    while (num_bigits > 0 && (*this)[num_bigits] == 0) --num_bigits;
    bigits_.resize(to_unsigned(num_bigits + 1));
  }